

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeGPRwithAPSRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus In;
  DecodeStatus local_34;
  void *pvStack_30;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint RegNo_local;
  MCInst *Inst_local;
  
  local_34 = MCDisassembler_Success;
  pvStack_30 = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = RegNo;
  pMStack_18 = Inst;
  if (RegNo == 0xf) {
    MCOperand_CreateReg0(Inst,2);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    In = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
    Check(&local_34,In);
    Inst_local._4_4_ = local_34;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeGPRwithAPSRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (RegNo == 15) {
		MCOperand_CreateReg0(Inst, ARM_APSR_NZCV);
		return MCDisassembler_Success;
	}

	Check(&S, DecodeGPRRegisterClass(Inst, RegNo, Address, Decoder));
	return S;
}